

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-multicast.c
# Opt level: O3

int mc_remote(lua_State *L)

{
  void *__ptr;
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)lua_touserdata(L,1);
  __ptr = (void *)*puVar1;
  lua_pushlightuserdata(L,*(void **)((long)__ptr + 8));
  lua_pushinteger(L,(ulong)*(uint *)((long)__ptr + 4));
  free(__ptr);
  return 2;
}

Assistant:

static int
mc_remote(lua_State *L) {
	struct mc_package **ptr = lua_touserdata(L,1);
	struct mc_package *pack = *ptr;
	lua_pushlightuserdata(L, pack->data);
	lua_pushinteger(L, (lua_Integer)(pack->size));
	skynet_free(pack);
	return 2;
}